

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetNavID(ImGuiID id,int nav_layer,ImGuiID focus_scope_id)

{
  ImGuiContext *pIVar1;
  bool local_21;
  ImGuiContext *g;
  ImGuiID focus_scope_id_local;
  int nav_layer_local;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow == (ImGuiWindow *)0x0) {
    __assert_fail("g.NavWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x22d9,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
  }
  local_21 = 1 < (uint)nav_layer;
  if (local_21) {
    __assert_fail("nav_layer == 0 || nav_layer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x22da,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
  }
  GImGui->NavId = id;
  pIVar1->NavFocusScopeId = focus_scope_id;
  pIVar1->NavWindow->NavLastIds[nav_layer] = id;
  return;
}

Assistant:

void ImGui::SetNavID(ImGuiID id, int nav_layer, ImGuiID focus_scope_id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindow);
    IM_ASSERT(nav_layer == 0 || nav_layer == 1);
    g.NavId = id;
    g.NavFocusScopeId = focus_scope_id;
    g.NavWindow->NavLastIds[nav_layer] = id;
}